

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# screening_interface.hpp
# Opt level: O0

void ExchCXX::lda_screening_interface<ExchCXX::BuiltinEPC18_1>::eval_exc_polar
               (double rho_a,double rho_b,double *eps)

{
  undefined8 *in_RDI;
  double in_XMM0_Qa;
  double x;
  double in_XMM1_Qa;
  double rho_s;
  double *in_stack_000000b0;
  double in_stack_000000b8;
  double in_stack_000000c0;
  double in_stack_ffffffffffffffd8;
  
  x = in_XMM0_Qa + in_XMM1_Qa;
  if (1e-24 < x) {
    safe_max<double>(x,in_stack_ffffffffffffffd8);
    safe_max<double>(x,in_stack_ffffffffffffffd8);
    kernel_traits<ExchCXX::BuiltinEPC18_1>::eval_exc_polar_impl
              (in_stack_000000c0,in_stack_000000b8,in_stack_000000b0);
  }
  else {
    *in_RDI = 0;
  }
  return;
}

Assistant:

BUILTIN_KERNEL_EVAL_RETURN
    eval_exc_polar( double rho_a, double rho_b, double& eps ) {

    const double rho_s = rho_a + rho_b;
    //const double rho_z = rho_a - rho_b;

    if( rho_s <= traits::dens_tol ) {
      eps = 0.;
    } else {
      rho_a = safe_max(rho_a, traits::dens_tol);
      rho_b = safe_max(rho_b, traits::dens_tol);
      traits::eval_exc_polar_impl( rho_a, rho_b, eps );
    }

  }